

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

GLuint __thiscall
gl4cts::DirectStateAccess::Framebuffers::TextureLayerAttachmentTest::MaxTextureLayers
          (TextureLayerAttachmentTest *this,GLenum texture_target)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  undefined4 *puVar4;
  GLuint local_2c;
  long lStack_28;
  GLint max_texture_size;
  Functions *gl;
  TextureLayerAttachmentTest *pTStack_18;
  GLenum texture_target_local;
  TextureLayerAttachmentTest *this_local;
  
  gl._4_4_ = texture_target;
  pTStack_18 = this;
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_28 = CONCAT44(extraout_var,iVar1);
  local_2c = 0x400;
  if ((gl._4_4_ != 0x806f) && (gl._4_4_ != 0x8c1a)) {
    if (gl._4_4_ == 0x9009) {
      (**(code **)(lStack_28 + 0x868))(0x8073,&local_2c);
      dVar2 = (**(code **)(lStack_28 + 0x800))();
      glu::checkError(dVar2,"glBindFramebuffer has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x4d0);
      return ((int)local_2c / 6) * 6;
    }
    if (gl._4_4_ != 0x9102) {
      puVar4 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar4 = 0;
      __cxa_throw(puVar4,&int::typeinfo,0);
    }
  }
  (**(code **)(lStack_28 + 0x868))(0x8073,&local_2c);
  dVar2 = (**(code **)(lStack_28 + 0x800))();
  glu::checkError(dVar2,"glBindFramebuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x4ca);
  return local_2c;
}

Assistant:

glw::GLuint TextureLayerAttachmentTest::MaxTextureLayers(glw::GLenum texture_target)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint max_texture_size = 1024 /* Specification default. */;

	switch (texture_target)
	{
	case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
	case GL_TEXTURE_2D_ARRAY:
	case GL_TEXTURE_3D:
		gl.getIntegerv(GL_MAX_3D_TEXTURE_SIZE, &max_texture_size);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

		return max_texture_size;

	case GL_TEXTURE_CUBE_MAP_ARRAY:
		gl.getIntegerv(GL_MAX_3D_TEXTURE_SIZE, &max_texture_size);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

		return (max_texture_size / 6) * 6; /* Make sure that max_texture_size is dividable by 6 */

	default:
		throw 0;
	}

	/* For compiler warnings only. */
	return 0;
}